

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EditorInterface.cpp
# Opt level: O1

void __thiscall EditorInterface::showFileDialog(EditorInterface *this,bool openFile,path *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *paVar1;
  element_type *peVar2;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _func_int **pp_Var5;
  size_type sVar6;
  _Link_type __z;
  undefined8 *puVar7;
  Vector2f *pVVar8;
  map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  *pmVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  float x;
  float y;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar10;
  shared_ptr<gui::Button> fileSubmitButton;
  shared_ptr<gui::MultilineTextBox> fileTextBox;
  shared_ptr<gui::DialogBox> fileDialog;
  shared_ptr<gui::Label> fileTitle;
  String local_c0;
  string local_a0;
  locale local_80 [8];
  DialogBox *local_78;
  undefined1 local_70 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  ContainerBase local_50;
  
  ::gui::Widget::sendToFront
            (&(((this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_Group).super_Container.super_Widget);
  peVar2 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar2->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase[3])(peVar2,1);
  peVar2 = (this->modalBackground_).super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::locale::locale((locale *)&local_a0);
  sf::String::String(&local_c0,"fileDialog",(locale *)&local_a0);
  ::gui::ContainerBase::getChild<gui::DialogBox>(&local_50,(String *)peVar2,SUB81(&local_c0,0));
  paVar1 = &local_c0.m_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_c0.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)&local_a0);
  pp_Var5 = local_50._vptr_ContainerBase;
  std::locale::locale((locale *)&local_a0);
  sf::String::String(&local_c0,"fileTitle",(locale *)&local_a0);
  ::gui::ContainerBase::getChild<gui::Label>
            ((ContainerBase *)
             &local_50.children_.
              super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(String *)pp_Var5,SUB81(&local_c0,0));
  local_78 = (DialogBox *)pp_Var5;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_c0.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)&local_a0);
  pp_Var5 = local_50._vptr_ContainerBase;
  std::locale::locale((locale *)&local_a0);
  sf::String::String(&local_c0,"fileTextBox",(locale *)&local_a0);
  ::gui::ContainerBase::getChild<gui::MultilineTextBox>
            ((ContainerBase *)(local_70 + 0x10),(String *)pp_Var5,SUB81(&local_c0,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_c0.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)&local_a0);
  pp_Var5 = local_50._vptr_ContainerBase;
  std::locale::locale((locale *)&local_a0);
  sf::String::String(&local_c0,"fileSubmitButton",(locale *)&local_a0);
  ::gui::ContainerBase::getChild<gui::Button>
            ((ContainerBase *)local_70,(String *)pp_Var5,SUB81(&local_c0,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_c0.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.m_string._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)&local_a0);
  if (openFile) {
    std::locale::locale((locale *)&local_a0);
    sf::String::String(&local_c0,"Open File",(locale *)&local_a0);
    ::gui::Label::setLabel
              ((Label *)local_50.children_.
                        super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_c0.m_string._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.m_string._M_dataplus._M_p);
    }
    std::locale::~locale((locale *)&local_a0);
    uVar3 = local_70._16_8_;
    ghc::filesystem::path::string_abi_cxx11_(&local_a0,filename);
    std::locale::locale(local_80);
    sf::String::String(&local_c0,&local_a0,local_80);
    ::gui::MultilineTextBox::setText((MultilineTextBox *)uVar3,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_c0.m_string._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.m_string._M_dataplus._M_p);
    }
    std::locale::~locale(local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    uVar3 = local_70._0_8_;
    std::locale::locale((locale *)&local_a0);
    sf::String::String(&local_c0,"Open",(locale *)&local_a0);
    ::gui::Button::setLabel((Button *)uVar3,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_c0.m_string._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.m_string._M_dataplus._M_p);
    }
    std::locale::~locale((locale *)&local_a0);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::clear(&(((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)(local_70._0_8_ + 0x250))->
             callbacks_)._M_t);
    p_Var4 = local_58;
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_58->_M_use_count = local_58->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_58->_M_use_count = local_58->_M_use_count + 1;
      }
    }
    pmVar9 = &((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)(local_70._0_8_ + 0x250))->
              callbacks_;
    sVar6 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count(pmVar9,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
    while (sVar6 != 0) {
      ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
      sVar6 = std::
              map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
              ::count(pmVar9,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
    }
    __z = (_Link_type)operator_new(0x50);
    *(int *)(__z->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
    puVar7 = (undefined8 *)operator_new(0x20);
    *puVar7 = this;
    puVar7[1] = local_78;
    puVar7[2] = local_70._16_8_;
    puVar7[3] = p_Var4;
    (__z->_M_storage)._M_storage[8] = '\0';
    (__z->_M_storage)._M_storage[9] = '\0';
    (__z->_M_storage)._M_storage[10] = '\0';
    (__z->_M_storage)._M_storage[0xb] = '\0';
    (__z->_M_storage)._M_storage[0xc] = '\0';
    (__z->_M_storage)._M_storage[0xd] = '\0';
    (__z->_M_storage)._M_storage[0xe] = '\0';
    (__z->_M_storage)._M_storage[0xf] = '\0';
    (__z->_M_storage)._M_storage[0x10] = '\0';
    (__z->_M_storage)._M_storage[0x11] = '\0';
    (__z->_M_storage)._M_storage[0x12] = '\0';
    (__z->_M_storage)._M_storage[0x13] = '\0';
    (__z->_M_storage)._M_storage[0x14] = '\0';
    (__z->_M_storage)._M_storage[0x15] = '\0';
    (__z->_M_storage)._M_storage[0x16] = '\0';
    (__z->_M_storage)._M_storage[0x17] = '\0';
    *(code **)((__z->_M_storage)._M_storage + 0x20) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:162:43)>
         ::_M_invoke;
    *(undefined8 **)((__z->_M_storage)._M_storage + 8) = puVar7;
    (__z->_M_storage)._M_storage[0x10] = '\0';
    (__z->_M_storage)._M_storage[0x11] = '\0';
    (__z->_M_storage)._M_storage[0x12] = '\0';
    (__z->_M_storage)._M_storage[0x13] = '\0';
    (__z->_M_storage)._M_storage[0x14] = '\0';
    (__z->_M_storage)._M_storage[0x15] = '\0';
    (__z->_M_storage)._M_storage[0x16] = '\0';
    (__z->_M_storage)._M_storage[0x17] = '\0';
    *(code **)((__z->_M_storage)._M_storage + 0x18) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:162:43)>
         ::_M_manager;
    (__z->_M_storage)._M_storage[0x28] = '\x01';
    (__z->_M_storage)._M_storage[0x29] = '\0';
    (__z->_M_storage)._M_storage[0x2a] = '\0';
    (__z->_M_storage)._M_storage[0x2b] = '\0';
    pVar10 = std::
             _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
             ::_M_get_insert_unique_pos(&pmVar9->_M_t,(key_type_conflict1 *)&__z->_M_storage);
    if (pVar10.second != (_Base_ptr)0x0) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
      ::_M_insert_node(&pmVar9->_M_t,pVar10.first,pVar10.second,__z);
      goto LAB_0015166c;
    }
  }
  else {
    std::locale::locale((locale *)&local_a0);
    sf::String::String(&local_c0,"Save As",(locale *)&local_a0);
    ::gui::Label::setLabel
              ((Label *)local_50.children_.
                        super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_c0.m_string._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.m_string._M_dataplus._M_p);
    }
    std::locale::~locale((locale *)&local_a0);
    uVar3 = local_70._16_8_;
    ghc::filesystem::path::string_abi_cxx11_(&local_a0,filename);
    std::locale::locale(local_80);
    sf::String::String(&local_c0,&local_a0,local_80);
    ::gui::MultilineTextBox::setText((MultilineTextBox *)uVar3,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_c0.m_string._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.m_string._M_dataplus._M_p);
    }
    std::locale::~locale(local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    uVar3 = local_70._0_8_;
    std::locale::locale((locale *)&local_a0);
    sf::String::String(&local_c0,"Save",(locale *)&local_a0);
    ::gui::Button::setLabel((Button *)uVar3,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_c0.m_string._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.m_string._M_dataplus._M_p);
    }
    std::locale::~locale((locale *)&local_a0);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
    ::clear(&(((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)(local_70._0_8_ + 0x250))->
             callbacks_)._M_t);
    p_Var4 = local_58;
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_58->_M_use_count = local_58->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_58->_M_use_count = local_58->_M_use_count + 1;
      }
    }
    pmVar9 = &((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)(local_70._0_8_ + 0x250))->
              callbacks_;
    sVar6 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
            ::count(pmVar9,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
    while (sVar6 != 0) {
      ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
      sVar6 = std::
              map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
              ::count(pmVar9,(key_type_conflict1 *)&::gui::priv::signalIdCounter);
    }
    __z = (_Link_type)operator_new(0x50);
    *(int *)(__z->_M_storage)._M_storage = ::gui::priv::signalIdCounter;
    puVar7 = (undefined8 *)operator_new(0x20);
    *puVar7 = this;
    puVar7[1] = local_78;
    puVar7[2] = local_70._16_8_;
    puVar7[3] = p_Var4;
    (__z->_M_storage)._M_storage[8] = '\0';
    (__z->_M_storage)._M_storage[9] = '\0';
    (__z->_M_storage)._M_storage[10] = '\0';
    (__z->_M_storage)._M_storage[0xb] = '\0';
    (__z->_M_storage)._M_storage[0xc] = '\0';
    (__z->_M_storage)._M_storage[0xd] = '\0';
    (__z->_M_storage)._M_storage[0xe] = '\0';
    (__z->_M_storage)._M_storage[0xf] = '\0';
    (__z->_M_storage)._M_storage[0x10] = '\0';
    (__z->_M_storage)._M_storage[0x11] = '\0';
    (__z->_M_storage)._M_storage[0x12] = '\0';
    (__z->_M_storage)._M_storage[0x13] = '\0';
    (__z->_M_storage)._M_storage[0x14] = '\0';
    (__z->_M_storage)._M_storage[0x15] = '\0';
    (__z->_M_storage)._M_storage[0x16] = '\0';
    (__z->_M_storage)._M_storage[0x17] = '\0';
    *(code **)((__z->_M_storage)._M_storage + 0x20) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:174:43)>
         ::_M_invoke;
    *(undefined8 **)((__z->_M_storage)._M_storage + 8) = puVar7;
    (__z->_M_storage)._M_storage[0x10] = '\0';
    (__z->_M_storage)._M_storage[0x11] = '\0';
    (__z->_M_storage)._M_storage[0x12] = '\0';
    (__z->_M_storage)._M_storage[0x13] = '\0';
    (__z->_M_storage)._M_storage[0x14] = '\0';
    (__z->_M_storage)._M_storage[0x15] = '\0';
    (__z->_M_storage)._M_storage[0x16] = '\0';
    (__z->_M_storage)._M_storage[0x17] = '\0';
    *(code **)((__z->_M_storage)._M_storage + 0x18) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tdepke2[P]CircuitSim2/src/EditorInterface.cpp:174:43)>
         ::_M_manager;
    (__z->_M_storage)._M_storage[0x28] = '\x01';
    (__z->_M_storage)._M_storage[0x29] = '\0';
    (__z->_M_storage)._M_storage[0x2a] = '\0';
    (__z->_M_storage)._M_storage[0x2b] = '\0';
    pVar10 = std::
             _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
             ::_M_get_insert_unique_pos(&pmVar9->_M_t,(key_type_conflict1 *)&__z->_M_storage);
    if (pVar10.second != (_Base_ptr)0x0) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
      ::_M_insert_node(&pmVar9->_M_t,pVar10.first,pVar10.second,__z);
      goto LAB_0015166c;
    }
  }
  ::gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>::~Callback
            ((Callback<gui::Widget_*,_const_sf::Vector2<float>_&> *)
             ((__z->_M_storage)._M_storage + 8));
  operator_delete(__z);
LAB_0015166c:
  pp_Var5 = local_50._vptr_ContainerBase;
  ::gui::priv::signalIdCounter = ::gui::priv::signalIdCounter + 1;
  pVVar8 = ::gui::DialogBox::getSize((DialogBox *)local_50._vptr_ContainerBase);
  ::gui::DialogBox::setSize((DialogBox *)pp_Var5,pVVar8);
  (*(((Group *)local_50._vptr_ContainerBase)->super_Container).super_ContainerBase.
    _vptr_ContainerBase[3])(local_50._vptr_ContainerBase,1);
  pVVar8 = ::gui::Panel::getSize
                     ((this->modalBackground_).
                      super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_78 = (DialogBox *)CONCAT44(local_78._4_4_,pVVar8->x);
  pVVar8 = ::gui::Panel::getSize
                     ((this->modalBackground_).
                      super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  x = local_78._0_4_ * 0.5;
  if (80.0 <= x) {
    x = 80.0;
  }
  y = pVVar8->y * 0.5;
  if (80.0 <= y) {
    y = 80.0;
  }
  ::gui::Widget::setPosition
            (&(((Group *)local_50._vptr_ContainerBase)->super_Container).super_Widget,x,y);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_50.children_.
      super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_50.children_.
               super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_50.children_.
      super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_50.children_.
               super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void EditorInterface::showFileDialog(bool openFile, const fs::path& filename) {
    modalBackground_->sendToFront();
    modalBackground_->setVisible(true);
    auto fileDialog = modalBackground_->getChild<gui::DialogBox>("fileDialog");
    auto fileDialogPtr = fileDialog.get();
    auto fileTitle = fileDialog->getChild<gui::Label>("fileTitle");
    auto fileTextBox = fileDialog->getChild<gui::MultilineTextBox>("fileTextBox");
    auto fileSubmitButton = fileDialog->getChild<gui::Button>("fileSubmitButton");

    if (openFile) {
        fileTitle->setLabel("Open File");
        fileTextBox->setText(filename.string());
        fileSubmitButton->setLabel("Open");
        fileSubmitButton->onClick.disconnectAll();
        fileSubmitButton->onClick.connect([this,fileDialogPtr,fileTextBox]() {
            fileDialogPtr->setVisible(false);
            modalBackground_->setVisible(false);
            if (!fileTextBox->getText().isEmpty()) {
                editor_.openBoard(true, fileTextBox->getText().toAnsiString());
            }
        });
    } else {
        fileTitle->setLabel("Save As");
        fileTextBox->setText(filename.string());
        fileSubmitButton->setLabel("Save");
        fileSubmitButton->onClick.disconnectAll();
        fileSubmitButton->onClick.connect([this,fileDialogPtr,fileTextBox]() {
            fileDialogPtr->setVisible(false);
            modalBackground_->setVisible(false);
            if (!fileTextBox->getText().isEmpty()) {
                editor_.saveAsBoard(fileTextBox->getText().toAnsiString());
            }
        });
    }

    // Force dialog to reposition widgets since labels changed.
    fileDialog->setSize(fileDialog->getSize());

    fileDialog->setVisible(true);
    fileDialog->setPosition(
        std::min(80.0f, modalBackground_->getSize().x / 2.0f),
        std::min(80.0f, modalBackground_->getSize().y / 2.0f)
    );
}